

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall deqp::gls::DrawTestSpec::DrawTestSpec(DrawTestSpec *this)

{
  DrawTestSpec *this_local;
  
  glu::ApiType::ApiType(&this->apiType);
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::vector(&this->attribs);
  this->primitive = PRIMITIVE_LAST;
  this->primitiveCount = 0;
  this->drawMethod = DRAWMETHOD_LAST;
  this->indexType = INDEXTYPE_LAST;
  this->indexPointerOffset = 0;
  this->indexStorage = STORAGE_LAST;
  this->first = 0;
  this->indexMin = 0;
  this->indexMax = 0;
  this->instanceCount = 0;
  this->indirectOffset = 0;
  this->baseVertex = 0;
  return;
}

Assistant:

DrawTestSpec::DrawTestSpec (void)
{
	primitive			= PRIMITIVE_LAST;
	primitiveCount		= 0;
	drawMethod			= DRAWMETHOD_LAST;
	indexType			= INDEXTYPE_LAST;
	indexPointerOffset	= 0;
	indexStorage		= STORAGE_LAST;
	first				= 0;
	indexMin			= 0;
	indexMax			= 0;
	instanceCount		= 0;
	indirectOffset		= 0;
	baseVertex			= 0;
}